

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void rectangular_partition_search
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
               MACROBLOCK *x,PC_TREE *pc_tree,RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,
               PartitionSearchState *part_search_state,RD_STATS *best_rdc,
               RD_RECT_PART_WIN_INFO *rect_part_win_info,RECT_PART_TYPE start_type,
               RECT_PART_TYPE end_type)

{
  uint uVar1;
  long lVar2;
  BLOCK_SIZE BVar3;
  int iVar4;
  ThreadData_conflict *td_00;
  RD_STATS *rd_stats;
  PICK_MODE_CONTEXT *pPVar5;
  ThreadData_conflict *in_RCX;
  AV1_COMP *in_RDX;
  long in_RDI;
  AV1_COMP *in_R8;
  TileDataEnc *in_R9;
  MACROBLOCK *in_stack_00000008;
  long in_stack_00000010;
  void *in_stack_00000018;
  long in_stack_00000020;
  byte in_stack_00000028;
  byte in_stack_00000030;
  PALETTE_MODE_INFO *pmi;
  MB_MODE_INFO *mbmi;
  int j;
  PARTITION_TYPE partition_type;
  int sub_part_idx;
  RECT_PART_TYPE i;
  PICK_MODE_CONTEXT **cur_ctx [2] [2];
  int is_not_edge_block [2];
  active_edge_info active_edge_type [2];
  int mi_pos_rect [2] [2] [2];
  int rect_partition_type [2];
  RD_STATS *sum_rdc;
  PartitionBlkParams blk_params;
  AV1_COMMON *cm;
  PARTITION_TYPE in_stack_fffffffffffffeb5;
  BLOCK_SIZE in_stack_fffffffffffffeb6;
  int in_stack_fffffffffffffeb8;
  RECT_PART_TYPE in_stack_fffffffffffffebf;
  uint in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  uint in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  AV1_COMP *cpi_00;
  MACROBLOCK *x_00;
  int local_f8;
  byte local_e9;
  RD_STATS *best_rdc_00;
  PartitionSearchState *part_search_state_00;
  PICK_MODE_CONTEXT *cur_partition_ctx;
  MACROBLOCK *x_01;
  TileDataEnc *in_stack_ffffffffffffff38;
  int local_a4;
  int idx;
  int mi_row;
  int mi_col;
  BLOCK_SIZE in_stack_ffffffffffffff78;
  undefined8 uVar6;
  undefined1 local_6c [4];
  int local_68;
  int local_64;
  int local_60;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar8;
  undefined1 in_stack_ffffffffffffffbc;
  undefined2 in_stack_ffffffffffffffbe;
  
  td_00 = (ThreadData_conflict *)(in_RDI + 0x3bf80);
  memcpy(local_6c,(void *)(in_stack_00000010 + 8),0x2c);
  rd_stats = (RD_STATS *)(in_stack_00000010 + 0x80);
  uVar6 = 0x200000001;
  local_a4 = local_64;
  best_rdc_00 = (RD_STATS *)&(in_R9->tile_info).tile_row;
  part_search_state_00 = (PartitionSearchState *)&in_R9->field_0x18;
  cur_partition_ctx = (PICK_MODE_CONTEXT *)&in_R9->tctx;
  x_01 = (MACROBLOCK *)((in_R9->tctx).txb_skip_cdf[0][1] + 1);
  idx = local_60;
  mi_row = local_68;
  mi_col = local_68;
  uVar7 = in_stack_ffffffffffffffb4;
  uVar8 = in_stack_ffffffffffffffb8;
  for (local_e9 = in_stack_00000028; local_e9 <= in_stack_00000030; local_e9 = local_e9 + 1) {
    iVar4 = is_rect_part_allowed
                      ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (PartitionSearchState *)
                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                       (active_edge_info *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8);
    if (iVar4 != 0) {
      uVar1 = *(uint *)(&stack0xffffffffffffff80 + (ulong)local_e9 * 4);
      BVar3 = get_partition_subsize(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb5);
      av1_init_rd_stats(rd_stats);
      cpi_00 = in_R8;
      for (local_f8 = 0; local_f8 < 2; local_f8 = local_f8 + 1) {
        if (**(long **)(&stack0xffffffffffffff18 + (long)local_f8 * 8 + (ulong)local_e9 * 0x10) == 0
           ) {
          pPVar5 = av1_alloc_pmc((AV1_COMP *)cur_ctx[1][1],cur_ctx[1][0]._7_1_,
                                 (PC_TREE_SHARED_BUFFERS *)cur_ctx[0][1]);
          **(undefined8 **)(&stack0xffffffffffffff18 + (long)local_f8 * 8 + (ulong)local_e9 * 0x10)
               = pPVar5;
          if (**(long **)(&stack0xffffffffffffff18 + (long)local_f8 * 8 + (ulong)local_e9 * 0x10) ==
              0) {
            aom_internal_error(*(aom_internal_error_info **)
                                (cpi_00->enc_quant_dequant_params).quants.y_zbin[0xb8],
                               AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
          }
        }
      }
      rd_stats->rate = *(int *)(*(long *)(in_stack_00000010 + 0xb8) + (ulong)(byte)uVar1 * 4);
      *(long *)(in_stack_00000010 + 0x90) =
           (long)rd_stats->rate *
           (long)*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) + 0x100 >>
           9;
      in_stack_fffffffffffffeb8 = (&local_a4)[(ulong)local_e9 * 4];
      in_stack_fffffffffffffec0 = (uint)BVar3;
      in_stack_fffffffffffffec8 = uVar1 & 0xff;
      rd_pick_rect_partition
                ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4),
                 in_stack_ffffffffffffff38,x_01,cur_partition_ctx,part_search_state_00,best_rdc_00,
                 idx,mi_row,mi_col,in_stack_ffffffffffffff78,(PARTITION_TYPE)uVar6);
      if ((*(long *)(in_stack_00000010 + 0x90) < *(long *)((long)in_stack_00000018 + 0x10)) &&
         (*(int *)(&stack0xffffffffffffff40 + (ulong)local_e9 * 4) != 0)) {
        lVar2 = **(long **)(&stack0xffffffffffffff18 + (ulong)local_e9 * 0x10);
        if ((*(char *)(lVar2 + 0x8e) == '\0') &&
           ((*(char *)(lVar2 + 0x8f) == '\0' && (*(char *)(lVar2 + 3) != '\r')))) {
          *(undefined4 *)(in_stack_00000010 + 0x110 + (ulong)local_e9 * 4) = 1;
        }
        av1_update_state(in_RDX,in_RCX,(PICK_MODE_CONTEXT *)cpi_00,(int)((ulong)in_R9 >> 0x20),
                         (int)in_R9,(BLOCK_SIZE)((ulong)td_00 >> 0x38),(RUN_TYPE)in_RDI);
        encode_superblock(cpi_00,in_R9,td_00,
                          (TokenExtra **)
                          CONCAT26(in_stack_ffffffffffffffbe,
                                   CONCAT15(BVar3,CONCAT14(in_stack_ffffffffffffffbc,uVar8))),
                          (RUN_TYPE)((uint)uVar7 >> 0x18),(BLOCK_SIZE)((uint)uVar7 >> 0x10),
                          (int *)in_RDX);
        in_stack_fffffffffffffeb8 = *(int *)(&stack0xffffffffffffff64 + (ulong)local_e9 * 0x10);
        in_stack_fffffffffffffec0 = (uint)BVar3;
        in_stack_fffffffffffffec8 = uVar1 & 0xff;
        rd_pick_rect_partition
                  ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4),
                   in_stack_ffffffffffffff38,x_01,cur_partition_ctx,part_search_state_00,best_rdc_00
                   ,idx,mi_row,mi_col,in_stack_ffffffffffffff78,(PARTITION_TYPE)uVar6);
      }
      if (*(long *)(in_stack_00000010 + 0x90) < *(long *)((long)in_stack_00000018 + 0x10)) {
        *(long *)(in_stack_00000010 + 0x90) =
             ((long)rd_stats->rate *
              (long)*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) + 0x100
             >> 9) + *(long *)(in_stack_00000010 + 0x88) * 0x80;
        if (*(long *)(in_stack_00000010 + 0x90) < *(long *)((long)in_stack_00000018 + 0x10)) {
          memcpy(in_stack_00000018,rd_stats,0x28);
          *(undefined1 *)(in_stack_00000010 + 0x144) = 1;
          *(byte *)&(in_R9->tile_info).mi_row_start = (byte)uVar1;
        }
      }
      else if (in_stack_00000020 != 0) {
        *(undefined4 *)(in_stack_00000020 + (ulong)local_e9 * 4) = 0;
      }
      x_00 = in_stack_00000008;
      in_R8 = cpi_00;
      av1_num_planes((AV1_COMMON *)td_00);
      av1_restore_context(x_00,(RD_SEARCH_MACROBLOCK_CONTEXT *)cpi_00,in_stack_fffffffffffffed4,
                          in_stack_fffffffffffffed0,
                          (BLOCK_SIZE)((uint)in_stack_fffffffffffffecc >> 0x18),
                          in_stack_fffffffffffffec8);
    }
  }
  return;
}

Assistant:

static void rectangular_partition_search(
    AV1_COMP *const cpi, ThreadData *td, TileDataEnc *tile_data,
    TokenExtra **tp, MACROBLOCK *x, PC_TREE *pc_tree,
    RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,
    PartitionSearchState *part_search_state, RD_STATS *best_rdc,
    RD_RECT_PART_WIN_INFO *rect_part_win_info, const RECT_PART_TYPE start_type,
    const RECT_PART_TYPE end_type) {
  const AV1_COMMON *const cm = &cpi->common;
  PartitionBlkParams blk_params = part_search_state->part_blk_params;
  RD_STATS *sum_rdc = &part_search_state->sum_rdc;
  const int rect_partition_type[NUM_RECT_PARTS] = { PARTITION_HORZ,
                                                    PARTITION_VERT };

  // mi_pos_rect[NUM_RECT_PARTS][SUB_PARTITIONS_RECT][0]: mi_row postion of
  //                                           HORZ and VERT partition types.
  // mi_pos_rect[NUM_RECT_PARTS][SUB_PARTITIONS_RECT][1]: mi_col postion of
  //                                           HORZ and VERT partition types.
  const int mi_pos_rect[NUM_RECT_PARTS][SUB_PARTITIONS_RECT][2] = {
    { { blk_params.mi_row, blk_params.mi_col },
      { blk_params.mi_row_edge, blk_params.mi_col } },
    { { blk_params.mi_row, blk_params.mi_col },
      { blk_params.mi_row, blk_params.mi_col_edge } }
  };

  // Initialize active edge_type function pointer
  // for HOZR and VERT partition types.
  active_edge_info active_edge_type[NUM_RECT_PARTS] = { av1_active_h_edge,
                                                        av1_active_v_edge };

  // Indicates edge blocks for HORZ and VERT partition types.
  const int is_not_edge_block[NUM_RECT_PARTS] = { blk_params.has_rows,
                                                  blk_params.has_cols };

  // Initialize pc tree context for HORZ and VERT partition types.
  PICK_MODE_CONTEXT **cur_ctx[NUM_RECT_PARTS][SUB_PARTITIONS_RECT] = {
    { &pc_tree->horizontal[0], &pc_tree->horizontal[1] },
    { &pc_tree->vertical[0], &pc_tree->vertical[1] }
  };

  // Loop over rectangular partition types.
  for (RECT_PART_TYPE i = start_type; i <= end_type; i++) {
    assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                   !part_search_state->partition_rect_allowed[i]));

    // Check if the HORZ / VERT partition search is to be performed.
    if (!is_rect_part_allowed(cpi, part_search_state, active_edge_type, i,
                              mi_pos_rect[i][0][i]))
      continue;

    // Sub-partition idx.
    int sub_part_idx = 0;
    PARTITION_TYPE partition_type = rect_partition_type[i];
    blk_params.subsize =
        get_partition_subsize(blk_params.bsize, partition_type);
    assert(blk_params.subsize <= BLOCK_LARGEST);
    av1_init_rd_stats(sum_rdc);
    for (int j = 0; j < SUB_PARTITIONS_RECT; j++) {
      if (cur_ctx[i][j][0] == NULL) {
        cur_ctx[i][j][0] =
            av1_alloc_pmc(cpi, blk_params.subsize, &td->shared_coeff_buf);
        if (!cur_ctx[i][j][0])
          aom_internal_error(x->e_mbd.error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }
    }
    sum_rdc->rate = part_search_state->partition_cost[partition_type];
    sum_rdc->rdcost = RDCOST(x->rdmult, sum_rdc->rate, 0);
#if CONFIG_COLLECT_PARTITION_STATS
    PartitionTimingStats *part_timing_stats =
        &part_search_state->part_timing_stats;
    if (best_rdc->rdcost - sum_rdc->rdcost >= 0) {
      start_partition_block_timer(part_timing_stats, partition_type);
    }
#endif

    // First sub-partition evaluation in HORZ / VERT partition type.
    rd_pick_rect_partition(
        cpi, tile_data, x, cur_ctx[i][sub_part_idx][0], part_search_state,
        best_rdc, 0, mi_pos_rect[i][sub_part_idx][0],
        mi_pos_rect[i][sub_part_idx][1], blk_params.subsize, partition_type);

    // Start of second sub-partition evaluation.
    // Evaluate second sub-partition if the first sub-partition cost
    // is less than the best cost and if it is not an edge block.
    if (sum_rdc->rdcost < best_rdc->rdcost && is_not_edge_block[i]) {
      const MB_MODE_INFO *const mbmi = &cur_ctx[i][sub_part_idx][0]->mic;
      const PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
      // Neither palette mode nor cfl predicted.
      if (pmi->palette_size[PLANE_TYPE_Y] == 0 &&
          pmi->palette_size[PLANE_TYPE_UV] == 0) {
        if (mbmi->uv_mode != UV_CFL_PRED)
          part_search_state->is_rect_ctx_is_ready[i] = 1;
      }
      av1_update_state(cpi, td, cur_ctx[i][sub_part_idx][0], blk_params.mi_row,
                       blk_params.mi_col, blk_params.subsize, DRY_RUN_NORMAL);
      encode_superblock(cpi, tile_data, td, tp, DRY_RUN_NORMAL,
                        blk_params.subsize, NULL);

      // Second sub-partition evaluation in HORZ / VERT partition type.
      sub_part_idx = 1;
      rd_pick_rect_partition(
          cpi, tile_data, x, cur_ctx[i][sub_part_idx][0], part_search_state,
          best_rdc, 1, mi_pos_rect[i][sub_part_idx][0],
          mi_pos_rect[i][sub_part_idx][1], blk_params.subsize, partition_type);
    }
    // Update HORZ / VERT best partition.
    if (sum_rdc->rdcost < best_rdc->rdcost) {
      sum_rdc->rdcost = RDCOST(x->rdmult, sum_rdc->rate, sum_rdc->dist);
      if (sum_rdc->rdcost < best_rdc->rdcost) {
        *best_rdc = *sum_rdc;
        part_search_state->found_best_partition = true;
        pc_tree->partitioning = partition_type;
      }
    } else {
      // Update HORZ / VERT win flag.
      if (rect_part_win_info != NULL)
        rect_part_win_info->rect_part_win[i] = false;
    }
#if CONFIG_COLLECT_PARTITION_STATS
    if (part_timing_stats->timer_is_on) {
      end_partition_block_timer(part_timing_stats, partition_type,
                                sum_rdc->rdcost);
    }
#endif
    av1_restore_context(x, x_ctx, blk_params.mi_row, blk_params.mi_col,
                        blk_params.bsize, av1_num_planes(cm));
  }
}